

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

pybind11 * __thiscall pybind11::move<std::__cxx11::string>(pybind11 *this,object *obj)

{
  int iVar1;
  cast_error *this_00;
  StringType *pSVar2;
  handle *handle;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_120;
  undefined1 local_fa;
  undefined1 local_f9;
  PyObject *local_c8;
  str local_c0;
  str local_b8 [4];
  char local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  detail *local_18;
  object *obj_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  local_18 = (detail *)obj;
  obj_local = (object *)this;
  iVar1 = detail::object_api<pybind11::handle>::ref_count((object_api<pybind11::handle> *)obj);
  if (iVar1 < 2) {
    local_fa = 0;
    detail::load_type<std::__cxx11::string>
              ((make_caster<std::__cxx11::basic_string<char>_> *)&local_120,local_18,handle);
    pSVar2 = detail::type_caster::operator_cast_to_string_((type_caster *)&local_120);
    std::__cxx11::string::string((string *)this,(string *)pSVar2);
    detail::
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~type_caster(&local_120);
    return this;
  }
  local_f9 = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  local_c8 = (PyObject *)
             detail::object_api<pybind11::handle>::get_type
                       ((object_api<pybind11::handle> *)local_18);
  str::str(&local_c0,(handle)local_c8);
  str::operator_cast_to_string(local_b8);
  std::operator+(local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "Unable to move from Python ");
  std::operator+(local_78,local_98);
  type_id<std::__cxx11::string>();
  std::operator+(local_58,local_78);
  std::operator+(local_38,(char *)local_58);
  cast_error::runtime_error(this_00,local_38);
  local_f9 = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}